

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void Rml::Parse::Term(DataParser *parser)

{
  char cVar1;
  Variant local_50;
  
  Factor(parser);
  do {
    if (parser->reached_end != false) {
      return;
    }
    cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
    if (cVar1 == '/') {
      DataParser::Match(parser,'/',true);
      DataParser::Push(parser);
      Factor(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_50);
      DataParser::Emit(parser,Divide,&local_50);
    }
    else {
      if (cVar1 != '*') {
        return;
      }
      DataParser::Match(parser,'*',true);
      DataParser::Push(parser);
      Factor(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_50);
      DataParser::Emit(parser,Multiply,&local_50);
    }
    Variant::~Variant(&local_50);
  } while( true );
}

Assistant:

static void Term(DataParser& parser)
	{
		Factor(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '*': Multiply(parser); break;
			case '/': Divide(parser); break;
			default: looping = false;
			}
		}
	}